

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

void __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          uint pageCount)

{
  BVIndex BVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  BVIndex BVar5;
  PageAllocatorBaseCommon *pPVar6;
  PreReservedVirtualAllocWrapper *this_00;
  AllocatorType *pAVar7;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *this_01;
  undefined8 *in_FS_OFFSET;
  
  if (address < (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x229,"(address >= this->address)","address >= this->address");
    if (!bVar4) goto LAB_0027abc8;
    *puVar2 = 0;
  }
  pPVar6 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).super_SegmentBaseCommon
           .allocator;
  pAVar7 = &pPVar6[-1].allocatorType;
  if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
    pAVar7 = (AllocatorType *)0x0;
  }
  if (pAVar7[0x28] < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22a,"(pageCount <= this->GetAllocator()->maxAllocPageCount)",
                       "pageCount <= this->GetAllocator()->maxAllocPageCount");
    if (!bVar4) goto LAB_0027abc8;
    *puVar2 = 0;
    pPVar6 = (this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
             super_SegmentBaseCommon.allocator;
  }
  pAVar7 = &pPVar6[-1].allocatorType;
  if (pPVar6 == (PageAllocatorBaseCommon *)0x0) {
    pAVar7 = (AllocatorType *)0x0;
  }
  if ((pAVar7[0x28] - pageCount) * 0x1000 <
      (uint)((int)address -
            *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).address)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22c,
                       "(((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize)"
                       ,
                       "((uint)(((char *)address) - this->address)) <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize"
                      );
    if (!bVar4) goto LAB_0027abc8;
    *puVar2 = 0;
  }
  bVar4 = IsFreeOrDecommitted(this,address,pageCount);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x22e,"(!IsFreeOrDecommitted(address, pageCount))",
                       "!IsFreeOrDecommitted(address, pageCount)");
    if (!bVar4) goto LAB_0027abc8;
    *puVar2 = 0;
  }
  BVStatic<272UL>::SetRange
            (&this->decommitPages,
             (uint)((int)address -
                   *(int *)&(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
                            address) >> 0xc,pageCount);
  this->decommitPageCount = this->decommitPageCount + pageCount;
  this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
             *)(this->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               super_SegmentBaseCommon.allocator;
  if (this_01 !=
      (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
       *)0x0) {
    this_01 = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
               *)&this_01[-1].numberOfSegments;
  }
  this_00 = PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
            ::GetVirtualAllocator(this_01);
  PreReservedVirtualAllocWrapper::Free(this_00,address,(ulong)(pageCount << 0xc),0x4000);
  BVar1 = this->decommitPageCount;
  BVar5 = BVStatic<272UL>::Count(&this->decommitPages);
  if (BVar1 != BVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x23b,"(decommitPageCount == (uint)this->GetCountOfDecommitPages())",
                       "decommitPageCount == (uint)this->GetCountOfDecommitPages()");
    if (!bVar4) {
LAB_0027abc8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  return;
}

Assistant:

void
PageSegmentBase<T>::DecommitPages(__in void * address, uint pageCount)
{
    Assert(address >= this->address);
    Assert(pageCount <= this->GetAllocator()->maxAllocPageCount);
    Assert(((uint)(((char *)address) - this->address))
      <= (this->GetAllocator()->maxAllocPageCount - pageCount) * AutoSystemInfo::PageSize);

    Assert(!IsFreeOrDecommitted(address, pageCount));
    uint base = this->GetBitRangeBase(address);

    this->SetRangeInDecommitPagesBitVector(base, pageCount);
    this->decommitPageCount += pageCount;

    if (!onlyUpdateState)
    {
#pragma warning(suppress: 6250)
        this->GetAllocator()->GetVirtualAllocator()->Free(address,
          pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
    }

    Assert(decommitPageCount == (uint)this->GetCountOfDecommitPages());
}